

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

void helper_dmthlip_mips64(target_ulong rs,target_ulong ac,CPUMIPSState_conflict5 *env)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = (uint)ac & 3;
  (env->active_tc).HI[uVar2] = (env->active_tc).LO[uVar2];
  (env->active_tc).LO[uVar2] = rs;
  uVar1 = (env->active_tc).DSPControl;
  if (((uint)uVar1 & 0x7f) < 0x41) {
    (env->active_tc).DSPControl = uVar1 & 0xffffffff ^ 0x40;
  }
  return;
}

Assistant:

void helper_dmthlip(target_ulong rs, target_ulong ac, CPUMIPSState *env)
{
    uint8_t ac_t;
    uint8_t pos;
    uint64_t tempB, tempA;

    ac_t = ac & 0x3;

    tempA = rs;
    tempB = env->active_tc.LO[ac_t];

    env->active_tc.HI[ac_t] = tempB;
    env->active_tc.LO[ac_t] = tempA;

    pos = get_DSPControl_pos(env);

    if (pos <= 64) {
        pos = pos + 64;
        set_DSPControl_pos(pos, env);
    }
}